

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger number_delegate_tochar(HSQUIRRELVM v)

{
  SQObject *this;
  SQString *x;
  SQChar local_48;
  SQObjectPtr local_30;
  SQChar local_19;
  SQObjectPtr *pSStack_18;
  SQChar c;
  SQObject *o;
  HSQUIRRELVM v_local;
  
  o = (SQObject *)v;
  pSStack_18 = stack_get(v,1);
  this = o;
  if ((pSStack_18->super_SQObject)._type == OT_FLOAT) {
    local_48 = (SQChar)(long)(pSStack_18->super_SQObject)._unVal.fFloat;
  }
  else {
    local_48 = (SQChar)(pSStack_18->super_SQObject)._unVal.nInteger;
  }
  local_19 = local_48;
  x = SQString::Create((SQSharedState *)o[0x11]._unVal.pTable,&local_19,1);
  SQObjectPtr::SQObjectPtr(&local_30,x);
  SQVM::Push((SQVM *)this,&local_30);
  SQObjectPtr::~SQObjectPtr(&local_30);
  return 1;
}

Assistant:

static SQInteger number_delegate_tochar(HSQUIRRELVM v)
{
    SQObject &o=stack_get(v,1);
    SQChar c = (SQChar)tointeger(o);
    v->Push(SQString::Create(_ss(v),(const SQChar *)&c,1));
    return 1;
}